

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O1

void __thiscall TGAImage::scale(TGAImage *this,size_t w,size_t h)

{
  size_t __n;
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tdata;
  allocator_type local_82;
  value_type_conflict2 local_81;
  size_t local_80;
  uint local_74;
  size_t local_70;
  int local_68;
  int local_64;
  uint local_60;
  int local_5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  size_t local_40;
  long local_38;
  
  if ((h != 0 && w != 0) &&
     ((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    local_81 = '\0';
    local_80 = w;
    local_70 = h;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_58,(ulong)this->bytespp * h * w,&local_81,&local_82);
    if (this->height != 0) {
      local_40 = (size_t)(int)(this->bytespp * (int)local_80);
      local_38 = (long)(int)(this->width * this->bytespp);
      lVar4 = 0;
      uVar2 = 0;
      iVar7 = 0;
      iVar3 = 0;
      do {
        lVar6 = (long)iVar3;
        local_74 = uVar2;
        local_68 = iVar3;
        local_64 = iVar7;
        if (this->width != 0) {
          iVar3 = -this->bytespp;
          uVar2 = 0;
          iVar7 = this->width - (int)local_80;
          local_5c = iVar3;
          do {
            local_5c = local_5c + this->bytespp;
            iVar7 = iVar7 + (int)local_80;
            uVar1 = this->width;
            local_60 = uVar2;
            if ((int)uVar1 <= iVar7) {
              lVar5 = (long)local_5c;
              do {
                iVar7 = iVar7 - uVar1;
                iVar3 = iVar3 + this->bytespp;
                memcpy(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + iVar3 + lVar6,
                       (this->data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5 + lVar4,(ulong)this->bytespp);
                uVar1 = this->width;
              } while ((int)uVar1 <= iVar7);
            }
            uVar2 = local_60 + 1;
          } while (uVar2 < this->width);
        }
        __n = local_40;
        uVar2 = local_74;
        iVar7 = local_64 + (int)local_70;
        uVar1 = this->height;
        iVar3 = local_68;
        if ((int)uVar1 <= iVar7) {
          do {
            if ((int)(uVar1 * 2) <= iVar7) {
              memcpy(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar6 + __n,
                     local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar6,__n);
            }
            uVar1 = this->height;
            iVar7 = iVar7 - uVar1;
            lVar6 = lVar6 + __n;
          } while ((int)uVar1 <= iVar7);
          iVar3 = (int)lVar6;
        }
        lVar4 = lVar4 + local_38;
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->height);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->data,&local_58);
    this->width = (uint32_t)local_80;
    this->height = (uint32_t)local_70;
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void TGAImage::scale(size_t w, size_t h)
{
    if (w <= 0 || h <= 0 || !data.size()) return;
    std::vector<std::uint8_t> tdata(w * h * bytespp, 0);
    int n_scanline = 0;
    int oscanline = 0;
    int err_y = 0;
    int n_line_bytes = w * bytespp;
    int olinebytes = width * bytespp;
    for (uint32_t j = 0; j < height; j++) {
        int errx = width - w;
        int nx = -static_cast<int>(bytespp);
        int ox = -static_cast<int>(bytespp);
        for (uint32_t i = 0; i < width; i++) {
            ox += bytespp;
            errx += w;
            while (errx >= (int)width) {
                errx -= width;
                nx += bytespp;
                memcpy(tdata.data() + n_scanline + nx, data.data() + oscanline + ox, bytespp);
            }
        }
        err_y += h;
        oscanline += olinebytes;
        while (err_y >= (int)height) {
            if (err_y >= (int)height << 1)  // it means we jump over a scanline
                memcpy(tdata.data() + n_scanline + n_line_bytes, tdata.data() + n_scanline,
                       n_line_bytes);
            err_y -= height;
            n_scanline += n_line_bytes;
        }
    }
    data = tdata;
    width = (uint32_t)w;
    height = (uint32_t)h;
}